

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::GradX
          (TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this,TPZVec<double> *par,TPZFMatrix<double> *gradx
          )

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZGeoElRefLess<pzgeom::TPZQuadTorus> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3,2);
  TPZFNMatrix<54,_double>::TPZFNMatrix
            ((TPZFNMatrix<54,_double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  CornerCoordinates(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pzgeom::TPZQuadTorus::GradX<double>
            ((TPZQuadTorus *)
             cornerco.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_,
             (TPZFMatrix<double> *)
             cornerco.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol,
             (TPZVec<double> *)
             cornerco.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
             (TPZFMatrix<double> *)
             cornerco.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x1718a73);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<REAL> &par, TPZFMatrix<REAL> &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}